

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstorageinfo.cpp
# Opt level: O0

void __thiscall QStorageInfo::QStorageInfo(QStorageInfo *this,QDir *dir)

{
  long lVar1;
  QString *in_RDI;
  long in_FS_OFFSET;
  QStorageInfoPrivate *in_stack_ffffffffffffff98;
  QStorageInfoPrivate *in_stack_ffffffffffffffa0;
  QString *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  operator_new(0xa0);
  QStorageInfoPrivate::QStorageInfoPrivate(in_stack_ffffffffffffffa0);
  QExplicitlySharedDataPointer<QStorageInfoPrivate>::QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QStorageInfoPrivate> *)in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98);
  QDir::absolutePath((QDir *)in_RDI);
  setPath((QStorageInfo *)this_00,in_RDI);
  QString::~QString((QString *)0x2f4451);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QStorageInfo::QStorageInfo(const QDir &dir)
    : d(new QStorageInfoPrivate)
{
    setPath(dir.absolutePath());
}